

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateAddNewDoubles(Fxu_Matrix *p,Fxu_Cube *pCube)

{
  Fxu_Cube *local_20;
  Fxu_Cube *pTemp;
  Fxu_Cube *pCube_local;
  Fxu_Matrix *p_local;
  
  if (pCube->pOrder == (Fxu_Cube *)0x0) {
    __assert_fail("pCube->pOrder",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuUpdate.c"
                  ,0x2d7,"void Fxu_UpdateAddNewDoubles(Fxu_Matrix *, Fxu_Cube *)");
  }
  if (pCube->pVar->ppPairs != (Fxu_Pair ***)0x0) {
    for (local_20 = pCube->pFirst; local_20->pVar == pCube->pVar; local_20 = local_20->pNext) {
      if (((local_20->lLits).nItems != 0) &&
         ((local_20->pOrder == (Fxu_Cube *)0x0 || (local_20->iCube < pCube->iCube)))) {
        Fxu_MatrixAddDivisor(p,local_20,pCube);
      }
    }
  }
  return;
}

Assistant:

void Fxu_UpdateAddNewDoubles( Fxu_Matrix * p, Fxu_Cube * pCube )
{
	Fxu_Cube * pTemp;
    assert( pCube->pOrder );

    // if the cube is a recently introduced one
    // it does not have pairs allocated
    // in this case, there is nothing to update
    if ( pCube->pVar->ppPairs == NULL )
        return;

	for ( pTemp = pCube->pFirst; pTemp->pVar == pCube->pVar; pTemp = pTemp->pNext )
    {
        // do not add pairs with the empty cubes
		if ( pTemp->lLits.nItems == 0 )
            continue;
        // to prevent adding duplicated pairs of the new cubes
        // do not add the pair, if the current cube is marked 
        if ( pTemp->pOrder && pTemp->iCube >= pCube->iCube )
            continue;
		Fxu_MatrixAddDivisor( p, pTemp, pCube );
    }
}